

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryCase::init
          (PrimitivesGeneratedQueryCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  ContextType ctxType;
  uint uVar7;
  int iVar8;
  pointer pcVar9;
  ShaderProgram *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  char *pcVar10;
  long lVar11;
  size_type __dnew;
  ostringstream geometrySource;
  size_type local_2f0;
  string local_2e8;
  string local_2c8;
  uint local_2a8;
  undefined4 uStack_2a4;
  value_type local_2a0;
  undefined1 local_280 [112];
  ios_base local_210 [8];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar6) &&
     (bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar6)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0x123b);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  switch(this->m_test) {
  case TEST_NO_GEOMETRY:
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_280 + 8),
               "Querying PRIMITIVES_GENERATED while rendering without a geometry shader.",0x48);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_NO_AMPLIFICATION:
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_280 + 8),
               "Querying PRIMITIVES_GENERATED while rendering with a non-amplifying geometry shader."
               ,0x54);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_AMPLIFICATION:
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_280 + 8),
               "Querying PRIMITIVES_GENERATED while rendering with a (3x) amplifying geometry shader."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_PARTIAL_PRIMITIVES:
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_280 + 8),
               "Querying PRIMITIVES_GENERATED while rendering with a geometry shader that emits also partial primitives."
               ,0x68);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_INSTANCED:
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_280 + 8),
               "Querying PRIMITIVES_GENERATED while rendering with a instanced geometry shader.",
               0x4f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_0039ec59_default;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
  std::ios_base::~ios_base(local_208);
switchD_0039ec59_default:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  if (this->m_test != TEST_NO_GEOMETRY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points"
               ,0x3d);
    bVar6 = this->m_test == TEST_INSTANCED;
    pcVar10 = SSBOArrayLengthTests::init::arraysSized + 1;
    if (bVar6) {
      pcVar10 = ", invocations = 3";
    }
    lVar11 = 0x11;
    if (!bVar6) {
      lVar11 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar10,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,
               ") in;\nlayout(triangle_strip, max_vertices = 7) out;\nin highp vec4 v_one[];\nvoid main (void)\n{\n\t// always taken\n\tif (v_one[0].x != 0.0)\n\t{\n\t\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[0].gl_Position + vec4(0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[0].gl_Position - vec4(0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n"
               ,0x192);
    uVar7 = this->m_test - TEST_AMPLIFICATION;
    if (uVar7 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,&DAT_009634ec + *(int *)(&DAT_009634ec + (ulong)uVar7 * 4),
                 *(long *)(&DAT_009634f8 + (ulong)uVar7 * 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
  }
  paVar1 = &local_2e8.field_2;
  local_2f0 = 0x9a;
  local_2e8._M_dataplus._M_p = (pointer)paVar1;
  pcVar9 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_2f0);
  sVar4 = local_2f0;
  local_2e8.field_2._M_allocated_capacity = local_2f0;
  local_2e8._M_dataplus._M_p = pcVar9;
  memcpy(pcVar9,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_one;\nout highp vec4 v_one;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_one = a_one;\n}\n"
         ,0x9a);
  local_2e8._M_string_length = sVar4;
  pcVar9[sVar4] = '\0';
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_2f0 = CONCAT44(local_2f0._4_4_,iVar8);
  specializeShader(&local_2c8,&local_2e8,(ContextType *)&local_2f0);
  local_2a8 = 0;
  paVar2 = &local_2a0.field_2;
  local_2a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2c8._M_dataplus._M_p,
             local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a8,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_2c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  local_2f0 = 0x82;
  local_2e8._M_dataplus._M_p = (pointer)paVar1;
  pcVar9 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_2f0);
  sVar4 = local_2f0;
  local_2e8.field_2._M_allocated_capacity = local_2f0;
  local_2e8._M_dataplus._M_p = pcVar9;
  memcpy(pcVar9,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
         ,0x82);
  local_2e8._M_string_length = sVar4;
  pcVar9[sVar4] = '\0';
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_2f0 = CONCAT44(local_2f0._4_4_,iVar8);
  specializeShader(&local_2c8,&local_2e8,(ContextType *)&local_2f0);
  local_2a8 = 1;
  local_2a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2c8._M_dataplus._M_p,
             local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a8,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  _Var5._M_p = local_2a0._M_dataplus._M_p;
  if ((size_type *)CONCAT44(uStack_2a4,local_2a8) != &local_2a0._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_2a4,local_2a8),local_2a0._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::__cxx11::stringbuf::str();
    iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    local_2f0 = CONCAT44(local_2f0._4_4_,iVar8);
    specializeShader(&local_2c8,&local_2e8,(ContextType *)&local_2f0);
    local_2a8 = 2;
    local_2a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_2c8._M_dataplus._M_p,
               local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + local_2a8,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
  std::ios_base::~ios_base(local_210);
  this->m_program = this_00;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_00);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"could not build program","");
    tcu::TestError::TestError(this_01,(string *)local_280);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return (int)this->m_program;
}

Assistant:

void PrimitivesGeneratedQueryCase::init (void)
{
	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// log what test tries to do

	if (m_test == TEST_NO_GEOMETRY)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering without a geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_NO_AMPLIFICATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a non-amplifying geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_AMPLIFICATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a (3x) amplifying geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_PARTIAL_PRIMITIVES)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a geometry shader that emits also partial primitives." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_INSTANCED)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a instanced geometry shader." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	// resources

	m_program = genProgram();
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build program");
}